

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_b72d1::Number<wchar_t>::Number(Number<wchar_t> *this)

{
  uint uVar1;
  Number<wchar_t> *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Number_002ecb30;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&this->out_);
  uVar1 = pstore::dump::number_base::default_base();
  this->base_ = uVar1;
  return;
}

Assistant:

Number ()
                : base_{pstore::dump::number_base::default_base ()} {}